

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O0

void Game::cardRules(Player *player,int cardInt)

{
  int iVar1;
  Dice *pDVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  string *psVar5;
  key_type local_94;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> local_90;
  key_type local_4c;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> local_48;
  int local_14;
  Player *pPStack_10;
  int cardInt_local;
  Player *player_local;
  
  local_14 = cardInt;
  pPStack_10 = player;
  switch(cardInt) {
  case 0:
    pDVar2 = Player::getDice(player);
    Dice::getLastResolvedHand(&local_48,pDVar2);
    local_4c = 5;
    pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](&local_48,&local_4c);
    iVar1 = *pmVar3;
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map(&local_48)
    ;
    if (iVar1 < 3) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "Cannot take this card, must roll atleast 3 Ouch!");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      Player::addVictoryPoints(pPStack_10,3);
      poVar4 = std::operator<<((ostream *)&std::cout,"Player : ");
      psVar5 = Player::getPlayerName_abi_cxx11_(pPStack_10);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4," added 3 victory points");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    break;
  case 1:
    break;
  case 2:
    pDVar2 = Player::getDice(player);
    Dice::getLastResolvedHand(&local_90,pDVar2);
    local_94 = 0;
    pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](&local_90,&local_94);
    iVar1 = *pmVar3;
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map(&local_90)
    ;
    if (0 < iVar1) {
      Player::removeEnergyCubes(pPStack_10,1);
      poVar4 = std::operator<<((ostream *)&std::cout,"Player : ");
      psVar5 = Player::getPlayerName_abi_cxx11_(pPStack_10);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4," removed 1 energy cube");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    break;
  case 3:
    Player::removeLifePoints(player,4);
    poVar4 = std::operator<<((ostream *)&std::cout,"Player : ");
    psVar5 = Player::getPlayerName_abi_cxx11_(pPStack_10);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    poVar4 = std::operator<<(poVar4," took 4 damage");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    break;
  case 4:
    break;
  case 5:
    break;
  case 6:
    break;
  case 7:
    break;
  case 8:
    break;
  case 9:
    iVar1 = Player::getZone(player);
    if ((0 < iVar1) && (iVar1 = Player::getZone(pPStack_10), iVar1 < 7)) {
      Player::addEnergyCubes(pPStack_10,1);
      poVar4 = std::operator<<((ostream *)&std::cout,"Player : ");
      psVar5 = Player::getPlayerName_abi_cxx11_(pPStack_10);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4," added 1 energy cube because he is in Manhattan");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    Player::addVictoryPoints(pPStack_10,2);
    poVar4 = std::operator<<((ostream *)&std::cout,"Player : ");
    psVar5 = Player::getPlayerName_abi_cxx11_(pPStack_10);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    poVar4 = std::operator<<(poVar4," added 2 victory pts");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    break;
  default:
    break;
  case 0x12:
    iVar1 = Player::getZone(player);
    if (iVar1 == 10) {
      Player::addEnergyCubes(pPStack_10,1);
      poVar4 = std::operator<<((ostream *)&std::cout,"Player : ");
      psVar5 = Player::getPlayerName_abi_cxx11_(pPStack_10);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4," added 1 energy cube because he is in Brooklyn");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    Player::addVictoryPoints(pPStack_10,3);
    poVar4 = std::operator<<((ostream *)&std::cout,"Player : ");
    psVar5 = Player::getPlayerName_abi_cxx11_(pPStack_10);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    poVar4 = std::operator<<(poVar4," added 3 victory pts");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Game::cardRules(Player* player, int cardInt) {
    // 0= "Energy", 1="Attack", 2="Destruction", 3="Heal", 4="Celebrity", 5="Ouch"

    switch(cardInt){
        case 0:
            if(player->getDice()->getLastResolvedHand()[5]> 2){
                player->addVictoryPoints(3);
                cout << "Player : " << player->getPlayerName() << " added 3 victory points" << endl;

            }
            else{
                cout << "Cannot take this card, must roll atleast 3 Ouch!" << endl;
            }
            break;
        case 1:

            break;
        case 2:
            if(player->getDice()->getLastResolvedHand()[0]>0){
                player->removeEnergyCubes(1);
                cout << "Player : " << player->getPlayerName() << " removed 1 energy cube" << endl;

            }
            break;
        case 3:
            player->removeLifePoints(4);
            cout << "Player : " << player->getPlayerName() << " took 4 damage" << endl;
            break;
        case 4:

            break;
        case 5:

            break;
        case 6:

            break;
        case 7:

            break;
        case 8:

            break;
        case 9:
            if(player->getZone() > 0 && player->getZone() < 7){
                player->addEnergyCubes(1);
                cout << "Player : " << player->getPlayerName() << " added 1 energy cube because he is in Manhattan" << endl;
            }
            player->addVictoryPoints(2);
            cout << "Player : " << player->getPlayerName() << " added 2 victory pts" << endl;
            break;
        case 18:
            if(player->getZone() ==10) {
                player->addEnergyCubes(1);
                cout << "Player : " << player->getPlayerName() << " added 1 energy cube because he is in Brooklyn" << endl;

            }
            player->addVictoryPoints(3);
            cout << "Player : " << player->getPlayerName() << " added 3 victory pts" << endl;
            break;
        default:
            break;
    }


}